

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O2

DdNode * Cudd_addSwapVariables(DdManager *dd,DdNode *f,DdNode **x,DdNode **y,int n)

{
  uint uVar1;
  DdHalfWord DVar2;
  DdHalfWord DVar3;
  int *permut;
  ulong uVar4;
  DdNode *pDVar5;
  ulong uVar6;
  
  uVar1 = dd->size;
  permut = (int *)malloc((long)(int)uVar1 * 4);
  if (permut == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    pDVar5 = (DdNode *)0x0;
  }
  else {
    uVar4 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      permut[uVar4] = (int)uVar4;
    }
    uVar4 = 0;
    uVar6 = (ulong)(uint)n;
    if (n < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      DVar2 = x[uVar4]->index;
      DVar3 = y[uVar4]->index;
      permut[(int)DVar2] = DVar3;
      permut[(int)DVar3] = DVar2;
    }
    pDVar5 = Cudd_addPermute(dd,f,permut);
    free(permut);
  }
  return pDVar5;
}

Assistant:

DdNode *
Cudd_addSwapVariables(
  DdManager * dd,
  DdNode * f,
  DdNode ** x,
  DdNode ** y,
  int  n)
{
    DdNode *swapped;
    int  i, j, k;
    int  *permut;

    permut = ABC_ALLOC(int,dd->size);
    if (permut == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < dd->size; i++) permut[i] = i;
    for (i = 0; i < n; i++) {
        j = x[i]->index;
        k = y[i]->index;
        permut[j] = k;
        permut[k] = j;
    }

    swapped = Cudd_addPermute(dd,f,permut);
    ABC_FREE(permut);

    return(swapped);

}